

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

StatementNode * __thiscall DL::Parser::gr_array(Parser *this)

{
  StatementNode *this_00;
  vector_t<DataNode_*> local_30;
  StatementNode *local_18;
  StatementNode *node;
  Parser *this_local;
  
  node = (StatementNode *)this;
  this_00 = (StatementNode *)operator_new(0x38);
  StatementNode::StatementNode(this_00);
  local_18 = this_00;
  std::__cxx11::string::operator=((string *)this_00,"");
  gr_data_list(&local_30,this);
  std::vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>::operator=
            (&local_18->Nodes,&local_30);
  std::vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>::~vector(&local_30);
  return local_18;
}

Assistant:

StatementNode* Parser::gr_array()
{
	StatementNode* node = new StatementNode;

	node->Name  = "";
	node->Nodes = gr_data_list();

	return node;
}